

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_precompile_own_augment
                 (lysc_ctx *ctx,lysp_node_augment *aug_p,lysp_module *pmod,lysp_ext_instance *ext)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  undefined8 *object;
  lysc_nodeid *nodeid;
  lysc_nodeid *local_38;
  
  local_38 = (lysc_nodeid *)0x0;
  LVar1 = lys_precompile_nodeid(ctx->ctx,(aug_p->field_0).node.name,&local_38);
  nodeid = local_38;
  if (LVar1 == LY_SUCCESS) {
    plVar2 = lys_schema_node_get_module(ctx->ctx,*local_38->prefix,pmod);
    if (plVar2 == (lys_module *)0x0) {
      LVar1 = LY_EINT;
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
             ,0x880);
    }
    else {
      LVar1 = LY_SUCCESS;
      if (plVar2 == ctx->cur_mod) {
        object = (undefined8 *)calloc(1,0x28);
        if (object == (undefined8 *)0x0) {
          LVar1 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_augment");
        }
        else {
          LVar1 = ly_set_add(&ctx->augs,object,'\x01',(uint32_t *)0x0);
          if (LVar1 == LY_SUCCESS) {
            *object = nodeid;
            object[1] = pmod;
            object[3] = ext;
            object[4] = aug_p;
            nodeid = (lysc_nodeid *)0x0;
            LVar1 = LY_SUCCESS;
          }
        }
      }
    }
  }
  lysc_nodeid_free(ctx->ctx,nodeid);
  return LVar1;
}

Assistant:

static LY_ERR
lys_precompile_own_augment(struct lysc_ctx *ctx, struct lysp_node_augment *aug_p, const struct lysp_module *pmod,
        const struct lysp_ext_instance *ext)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_nodeid *nodeid = NULL;
    struct lysc_augment *aug;
    const struct lys_module *mod;

    /* compile its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, aug_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* augment for another module, ignore */
        goto cleanup;
    }

    /* allocate new compiled augment and store it in the set */
    aug = calloc(1, sizeof *aug);
    LY_CHECK_ERR_GOTO(!aug, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
    LY_CHECK_GOTO(ret = ly_set_add(&ctx->augs, aug, 1, NULL), cleanup);

    aug->nodeid = nodeid;
    nodeid = NULL;
    aug->aug_pmod = pmod;
    aug->ext = ext;
    aug->aug_p = aug_p;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}